

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>
          (cow_guarded<int,_std::timed_mutex> *this,int *data)

{
  shared_ptr<int> local_28;
  int *local_18;
  int *data_local;
  cow_guarded<int,_std::timed_mutex> *this_local;
  
  local_18 = data;
  data_local = (int *)this;
  std::make_shared<int,int>((int *)&local_28);
  lr_guarded<std::shared_ptr<int_const>,std::mutex>::lr_guarded<std::shared_ptr<int>>
            ((lr_guarded<std::shared_ptr<int_const>,std::mutex> *)this,&local_28);
  std::shared_ptr<int>::~shared_ptr(&local_28);
  std::timed_mutex::timed_mutex(&this->m_writeMutex);
  return;
}

Assistant:

cow_guarded<T, M>::cow_guarded(Us&&... data):
    m_data(std::make_shared<T>(std::forward<Us>(data)...))
{
}